

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm-start.h
# Opt level: O1

bool __thiscall WarmStartBrancher::finished(WarmStartBrancher *this)

{
  uint uVar1;
  uint uVar2;
  Lit *pLVar3;
  lbool lVar4;
  char *pcVar5;
  char cVar6;
  bool bVar7;
  uint uVar8;
  int *pt;
  TrailElem local_28;
  
  bVar7 = true;
  if (engine.conflicts <= this->init_conflicts) {
    local_28.x = this->pos;
    if (local_28.x < (int)(this->decs).sz) {
      uVar1 = (this->decs).data[(uint)local_28.x].x;
      cVar6 = -sat.assigns.data[(uint)((int)uVar1 >> 1)];
      if ((uVar1 & 1) == 0) {
        cVar6 = sat.assigns.data[(uint)((int)uVar1 >> 1)];
      }
      if (cVar6 == ::l_Undef.value) {
        bVar7 = false;
      }
      else {
        if (engine.conflicts < this->init_conflicts) {
          local_28.sz = 4;
          local_28.pt = &this->pos;
          vec<TrailElem>::push(&engine.trail,&local_28);
        }
        pcVar5 = sat.assigns.data;
        lVar4.value = ::l_Undef.value;
        uVar1 = (this->decs).sz;
        uVar8 = this->pos;
        pLVar3 = (this->decs).data;
        do {
          uVar8 = uVar8 + 1;
          this->pos = uVar8;
          bVar7 = (int)uVar1 <= (int)uVar8;
          if ((int)uVar1 <= (int)uVar8) {
            return bVar7;
          }
          uVar2 = pLVar3[uVar8].x;
          cVar6 = -pcVar5[(uint)((int)uVar2 >> 1)];
          if ((uVar2 & 1) == 0) {
            cVar6 = pcVar5[(uint)((int)uVar2 >> 1)];
          }
        } while (cVar6 != lVar4.value);
      }
    }
  }
  return bVar7;
}

Assistant:

bool finished() override {
		// Already deactivated
		if (engine.conflicts > init_conflicts) {
			return true;
		}

		if (pos < static_cast<int>(decs.size())) {
			if (sat.value(decs[pos]) == l_Undef) {
				return false;
			}
			if (engine.conflicts < init_conflicts) {
				trailSave(pos);
			}
			for (++pos; pos < static_cast<int>(decs.size()); ++pos) {
				if (sat.value(decs[pos]) == l_Undef) {
					return false;
				}
			}
		}
		return true;
	}